

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O0

bool __thiscall
ElectricityBill::GetInfoFromUrl(ElectricityBill *this,string *request_url,RoomInfo *room_info)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  pointer ppVar5;
  int *piVar6;
  int local_44 [3];
  iterator iStack_38;
  int i;
  _Self local_30;
  iterator find_result;
  RoomInfo *room_info_local;
  string *request_url_local;
  ElectricityBill *this_local;
  
  find_result._M_node = (_Base_ptr)room_info;
  lVar3 = std::__cxx11::string::length();
  if ((lVar3 != 8) && (lVar3 = std::__cxx11::string::length(), lVar3 != 7)) {
    return false;
  }
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url);
  std::__cxx11::string::operator+=((string *)find_result._M_node,*pcVar4);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&name_map_abi_cxx11_,find_result._M_node);
  iStack_38 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&name_map_abi_cxx11_);
  bVar2 = std::operator!=(&local_30,&stack0xffffffffffffffc8);
  if (bVar2) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    std::__cxx11::string::operator=((string *)find_result._M_node,(string *)&ppVar5->second);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url);
    if (('/' < *pcVar4) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url), *pcVar4 < ':')) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url);
      std::__cxx11::string::operator+=((string *)find_result._M_node,*pcVar4);
      std::__cxx11::string::operator+=((string *)find_result._M_node,anon_var_dwarf_bf60);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url);
      if (('@' < *pcVar4) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url), *pcVar4 < 'D')) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url);
        std::__cxx11::string::operator=((string *)(find_result._M_node + 1),*pcVar4);
        local_44[2] = 4;
        while( true ) {
          iVar1 = local_44[2];
          local_44[1] = 8;
          local_44[0] = std::__cxx11::string::length();
          piVar6 = std::min<int>(local_44 + 1,local_44);
          if (*piVar6 <= iVar1) {
            return true;
          }
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url);
          if ((*pcVar4 < '0') ||
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url), '9' < *pcVar4))
          break;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)request_url);
          std::__cxx11::string::operator+=((string *)(find_result._M_node + 1),*pcVar4);
          local_44[2] = local_44[2] + 1;
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool ElectricityBill::GetInfoFromUrl(const std::string& request_url, RoomInfo* room_info)
{
	// "/M2A4000"
	if (request_url.length() != 8 && request_url.length() != 7)
	{
		return false;
	}

	room_info->flatname += request_url[1];

	auto find_result = name_map.find(room_info->flatname);
	if (find_result != name_map.end())
	{
		room_info->flatname = find_result->second;
	}
	else
	{
		return false;
	}


	if (request_url[2] < '0' || request_url[2] > '9')
	{
		return false;
	}
	room_info->flatname += request_url[2];
	room_info->flatname += "楼"; // 梅2楼

	if (request_url[3] < 'A' || request_url[3] > 'C')
	{
		return false;
	}

	room_info->roomname = request_url[3];

	//  /M2A4000

	for (int i = 4; i < std::min(8, static_cast<int>(request_url.length())); ++i)
	{
		if (request_url[i] < '0' || request_url[i] > '9')
		{
			return false;
		}
		else
		{
			room_info->roomname += request_url[i];
		}
	}
	return true;
}